

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O0

size_t MULTICLASS::read_cached_label(shared_data *param_1,void *v,io_buf *cache)

{
  size_t sVar1;
  label_t *in_RSI;
  size_t total;
  char *c;
  label_t *ld;
  undefined8 local_30;
  size_t in_stack_fffffffffffffff8;
  
  sVar1 = io_buf::buf_read((io_buf *)c,(char **)total,in_stack_fffffffffffffff8);
  if (sVar1 < 8) {
    sVar1 = 0;
  }
  else {
    bufread_label(in_RSI,local_30);
    sVar1 = 8;
  }
  return sVar1;
}

Assistant:

size_t read_cached_label(shared_data*, void* v, io_buf& cache)
{
  label_t* ld = (label_t*)v;
  char* c;
  size_t total = sizeof(ld->label) + sizeof(ld->weight);
  if (cache.buf_read(c, total) < total)
    return 0;
  bufread_label(ld, c);

  return total;
}